

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O2

void fiowrt(mcmcxdef *mctx,voccxdef *vctx,tokcxdef *tokctx,tokthdef *tab,uchar *fmts,uint fmtl,
           char *fname,uint flags,objnum preinit,int extc,uint prpcnt,char *filever)

{
  undefined1 uVar1;
  undefined1 uVar2;
  char cVar3;
  byte bVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  errcxdef *ctx;
  vocidef *pvVar8;
  lindef *plVar9;
  uchar *__ptr;
  osfildef *__stream;
  vocdef *pvVar10;
  uint16_t tmp;
  uint inc;
  FILE *__stream_00;
  size_t sVar11;
  long lVar12;
  tm *__tp;
  ulong uVar13;
  size_t sVar14;
  long __off;
  ulong uVar15;
  vocidef ***pppvVar16;
  vocdef *pvVar17;
  uint seed;
  lindef **pplVar18;
  uint16_t tmp_4;
  int iVar19;
  char *pcVar20;
  uint *puVar21;
  uint16_t tmp_6;
  vocidef **ppvVar22;
  int iVar23;
  int iVar24;
  undefined2 local_1668;
  undefined1 uStack_1666;
  undefined1 uStack_1665;
  ushort local_1664;
  undefined1 uStack_1662;
  byte local_1661;
  undefined1 uStack_1660;
  undefined2 auStack_165f [47];
  ulong local_1600;
  vocidef ***local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  vocdef **local_15e0;
  ulong local_15d8;
  vocidef ***local_15d0;
  long local_15c8;
  uchar *local_15c0;
  tokcxdef *local_15b8;
  fiowcxdef cbctx;
  time_t timer;
  errdef fr_;
  char flag_buf [2];
  char fastnamebuf [4096];
  
  local_15c0 = fmts;
  __stream_00 = fopen(fname,"w+b");
  if (__stream_00 == (FILE *)0x0) {
    errsigf(vctx->voccxerr,"TADS",600);
  }
  fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  if (fr_.errcode != 0) {
    vctx->voccxerr->errcxptr = fr_.errprv;
    fclose(__stream_00);
    errrse1(vctx->voccxerr,&fr_);
  }
  fr_.errprv = vctx->voccxerr->errcxptr;
  vctx->voccxerr->errcxptr = &fr_;
  ctx = vctx->voccxerr;
  cVar3 = *filever;
  inc = 0x40;
  seed = 0x3f;
  if (cVar3 == '*') {
LAB_00117431:
    pcVar20 = "v2.2.0";
  }
  else if (cVar3 == 'a') {
    pcVar20 = "v2.0.0";
    inc = 0x1d;
    seed = 0x11;
  }
  else {
    if (cVar3 == 'c') goto LAB_00117431;
    if (cVar3 != 'b') {
      errsigf(ctx,"TADS",0x267);
    }
    pcVar20 = "v2.0.1";
  }
  local_15b8 = tokctx;
  sVar11 = fwrite("TADS2 bin\n\r\x1a",0xd,1,__stream_00);
  if ((sVar11 == 1) && (sVar11 = fwrite(pcVar20,7,1,__stream_00), sVar11 == 1)) {
    lVar12 = ftell(__stream_00);
    local_1668._0_1_ = (uchar)flags;
    local_1668._1_1_ = (undefined1)(flags >> 8);
    sVar11 = fwrite(&local_1668,2,1,__stream_00);
    if (sVar11 == 1) {
      local_15c8 = lVar12;
      timer = time((time_t *)0x0);
      __tp = localtime(&timer);
      pcVar20 = asctime(__tp);
      strcpy(vctx->voccxtim,pcVar20);
      sVar11 = fwrite(vctx->voccxtim,0x1a,1,__stream_00);
      if (sVar11 == 1) {
        if (*filever != 'a') {
          uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x03XSI");
          local_1668._0_1_ = (uchar)seed;
          local_1668._1_1_ = (undefined1)inc;
          sVar11 = fwrite(&local_1668,2,1,__stream_00);
          if (sVar11 != 1) goto LAB_00117926;
          fiowcls((osfildef *)__stream_00,ctx,uVar13);
        }
        if (extc != 0) {
          uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x06EXTCNT");
          local_1668._0_1_ = (uchar)extc;
          local_1668._1_1_ = (undefined1)((uint)extc >> 8);
          sVar11 = fwrite(&local_1668,2,1,__stream_00);
          if (sVar11 != 1) goto LAB_0011791b;
          if (*filever != 'a') {
            local_1668._0_1_ = '\0';
            local_1668._1_1_ = 0;
            uStack_1666 = 0;
            uStack_1665 = 0;
            sVar11 = fwrite(&local_1668,4,1,__stream_00);
            if (sVar11 != 1) goto LAB_0011791b;
          }
          fiowcls((osfildef *)__stream_00,ctx,uVar13);
        }
        if (G_cmap_id[0] != '\0') {
          if ((byte)(*filever + 0x9fU) < 3) {
            errsigf(ctx,"TADS",0x268);
          }
          uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x06CHRSET");
          sVar11 = strlen(G_cmap_ldesc);
          sVar11 = sVar11 + 1;
          local_1668._0_1_ = (uchar)sVar11;
          local_1668._1_1_ = (undefined1)(sVar11 >> 8);
          sVar14 = fwrite(G_cmap_id,4,1,__stream_00);
          if (((sVar14 != 1) || (sVar14 = fwrite(&local_1668,2,1,__stream_00), sVar14 != 1)) ||
             (sVar11 = fwrite(G_cmap_ldesc,sVar11,1,__stream_00), sVar11 != 1)) goto LAB_0011791b;
          fiowcls((osfildef *)__stream_00,ctx,uVar13);
        }
        uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x03OBJ");
        cbctx.fiowcxund = 0;
        cbctx.fiowcxdebug = flags & 1;
        cbctx.fiowcxmem = mctx;
        cbctx.fiowcxerr = ctx;
        cbctx.fiowcxfp = (osfildef *)__stream_00;
        cbctx.fiowcxseed = seed;
        cbctx.fiowcxinc = inc;
        if ((flags & 0x20) == 0) {
          cbctx.fiowcxffp = (osfildef *)0x0;
        }
        else {
          cbctx.fiowcxffp = os_create_tempfile((char *)0x0,fastnamebuf);
          lVar12 = local_15c8;
          if (cbctx.fiowcxffp == (osfildef *)0x0) {
            flags = flags & 0xffffffdf;
            __off = ftell(__stream_00);
            fseek(__stream_00,lVar12,0);
            flag_buf = SUB42(flags,0);
            sVar11 = fwrite(flag_buf,2,1,__stream_00);
            if (sVar11 != 1) goto LAB_0011791b;
            fseek(__stream_00,__off,0);
          }
        }
        local_15f0 = uVar13;
        cbctx.fiowcxflg = flags;
        toktheach(&tab->tokthsc,fiowrtobj,&cbctx);
        pppvVar16 = vctx->voccxinh;
        local_15d0 = pppvVar16;
        for (iVar23 = 0; iVar23 != 0x80; iVar23 = iVar23 + 1) {
          ppvVar22 = *pppvVar16;
          if (ppvVar22 != (vocidef **)0x0) {
            for (lVar12 = 0; (int)lVar12 != 0x100; lVar12 = lVar12 + 1) {
              pvVar8 = ppvVar22[lVar12];
              if ((pvVar8 != (vocidef *)0x0) &&
                 (bVar4 = (pvVar8->vociu).vocius.vociusflg, (bVar4 & 0x10) != 0)) {
                (pvVar8->vociu).vocius.vociusflg = bVar4 & 0xef;
                flag_buf[0] = '\x02';
                fiowrtobj(&cbctx,(toksdef *)flag_buf);
              }
            }
          }
          pppvVar16 = pppvVar16 + 1;
        }
        fiowcls((osfildef *)__stream_00,ctx,local_15f0);
        __stream = cbctx.fiowcxffp;
        if (cbctx.fiowcxffp == (osfildef *)0x0) {
LAB_00117961:
          local_15e8 = fiowhd((osfildef *)__stream_00,ctx,"\x03INH");
          iVar24 = 0x100;
          pppvVar16 = local_15d0;
          for (iVar23 = 0; iVar23 != 0x80; iVar23 = iVar23 + 1) {
            ppvVar22 = *pppvVar16;
            local_15f8 = pppvVar16;
            if (ppvVar22 != (vocidef **)0x0) {
              for (iVar19 = iVar23 << 8; iVar19 != iVar24; iVar19 = iVar19 + 1) {
                pvVar8 = *ppvVar22;
                if (pvVar8 != (vocidef *)0x0) {
                  local_1668._0_1_ = (pvVar8->vociu).vocius.vociusflg;
                  local_1668._1_1_ = (undefined1)iVar19;
                  uStack_1666 = (undefined1)((uint)iVar19 >> 8);
                  uVar5 = *(undefined4 *)((long)&pvVar8->vociu + 2);
                  uStack_1665 = (undefined1)uVar5;
                  local_1664 = (ushort)((uint)uVar5 >> 8);
                  uStack_1662 = (undefined1)((uint)uVar5 >> 0x18);
                  local_1661 = pvVar8->vocinsc;
                  uStack_1660 = 0;
                  for (uVar15 = 0; local_1661 != uVar15; uVar15 = uVar15 + 1) {
                    if (uVar15 == 0x50) {
                      errsigf(ctx,"TADS",0x25a);
                    }
                    auStack_165f[uVar15] = *(undefined2 *)((long)&pvVar8->vociu + uVar15 * 2 + 6);
                  }
                  sVar11 = fwrite(&local_1668,(ulong)local_1661 * 2 + 9,1,__stream_00);
                  if (sVar11 != 1) goto LAB_0011791b;
                }
                ppvVar22 = ppvVar22 + 1;
              }
            }
            pppvVar16 = local_15f8 + 1;
            iVar24 = iVar24 + 0x100;
          }
          fiowcls((osfildef *)__stream_00,ctx,local_15e8);
          if (fmtl != 0) {
            uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x06FMTSTR");
            __ptr = local_15c0;
            local_1668._0_1_ = (uchar)fmtl;
            local_1668._1_1_ = (undefined1)(fmtl >> 8);
            if ((flags & 8) != 0) {
              fioxor(local_15c0,fmtl,seed,inc);
            }
            sVar11 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar11 != 1) goto LAB_00117926;
            sVar11 = fwrite(__ptr,(ulong)fmtl,1,__stream_00);
            if (sVar11 != 1) goto LAB_00117926;
            fiowcls((osfildef *)__stream_00,ctx,uVar13);
          }
          if ((flags & 4) != 0) {
            uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\aPREINIT");
            local_1668 = preinit;
            sVar11 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar11 != 1) goto LAB_00117926;
            fiowcls((osfildef *)__stream_00,ctx,uVar13);
          }
          uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x03REQ");
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxme);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxvtk);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxstr);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxnum);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxprd);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxvag);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxini);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpre);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxper);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxprom);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpdis);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxper2);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpdef);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpask);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxppc);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpask2);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxperp);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpostprom);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxinitrestore);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpuv);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpnp);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpostact);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxendcmd);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxprecmd);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpask3);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpre2);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpdef2);
          fiowcls((osfildef *)__stream_00,ctx,uVar13);
          if (vctx->voccxcpl != 0) {
            uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x04CMPD");
            uVar6 = vctx->voccxcpl;
            local_1668._0_1_ = (uchar)uVar6;
            local_1668._1_1_ = (undefined1)(uVar6 >> 8);
            if ((flags & 8) != 0) {
              fioxor((uchar *)vctx->voccxcpp,uVar6,seed,inc);
            }
            sVar11 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar11 != 1) goto LAB_00117926;
            sVar11 = fwrite(vctx->voccxcpp,(ulong)(uint)vctx->voccxcpl,1,__stream_00);
            if (sVar11 != 1) goto LAB_00117926;
            fiowcls((osfildef *)__stream_00,ctx,uVar13);
          }
          if (vctx->voccxspl != 0) {
            uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\bSPECWORD");
            uVar6 = vctx->voccxspl;
            local_1668._0_1_ = (uchar)uVar6;
            local_1668._1_1_ = (undefined1)(uVar6 >> 8);
            if ((flags & 8) != 0) {
              fioxor((uchar *)vctx->voccxspp,uVar6,seed,inc);
            }
            sVar11 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar11 != 1) goto LAB_00117926;
            sVar11 = fwrite(vctx->voccxspp,(ulong)(uint)vctx->voccxspl,1,__stream_00);
            if (sVar11 != 1) goto LAB_00117926;
            fiowcls((osfildef *)__stream_00,ctx,uVar13);
          }
          local_15d8 = fiowhd((osfildef *)__stream_00,ctx,"\x03VOC");
          pvVar17 = (vocdef *)vctx->voccxhsh;
          for (iVar23 = 0; pvVar10 = pvVar17, iVar23 != 0x100; iVar23 = iVar23 + 1) {
            while (local_15e0 = &pvVar10->vocnxt, pvVar17 = pvVar17->vocnxt,
                  pvVar17 != (vocdef *)0x0) {
              if ((flags & 8) != 0) {
                fioxor(pvVar17->voctxt,(uint)pvVar17->vocln2 + (uint)pvVar17->voclen,seed,inc);
              }
              uVar7 = pvVar17->vocwlst;
              if (uVar7 == 0xffffffff) {
                puVar21 = (uint *)0x0;
              }
              else {
                puVar21 = (uint *)((long)&vctx->voccxwp[(ulong)uVar7 / 2000]->vocwnxt +
                                  (ulong)(uVar7 % 2000 << 3));
              }
              while (pvVar10 = (vocdef *)local_15e0, puVar21 != (uint *)0x0) {
                *(byte *)((long)puVar21 + 7) = *(byte *)((long)puVar21 + 7) & 0xfb;
                uVar1 = pvVar17->voclen;
                uVar2 = pvVar17->vocln2;
                local_1668._1_1_ = 0;
                uStack_1665 = 0;
                local_1664 = (ushort)*(byte *)((long)puVar21 + 6);
                uStack_1662 = (undefined1)(short)puVar21[1];
                local_1661 = (byte)((ushort)(short)puVar21[1] >> 8);
                uStack_1660 = *(undefined1 *)((long)puVar21 + 7);
                auStack_165f[0]._0_1_ = 0;
                local_1668._0_1_ = uVar1;
                uStack_1666 = uVar2;
                sVar11 = fwrite(&local_1668,10,1,__stream_00);
                if (sVar11 != 1) goto LAB_0011791b;
                sVar11 = fwrite(pvVar17->voctxt,(ulong)pvVar17->vocln2 + (ulong)pvVar17->voclen,1,
                                __stream_00);
                if (sVar11 != 1) goto LAB_0011791b;
                uVar7 = *puVar21;
                puVar21 = (uint *)0x0;
                local_1668 = CONCAT11(local_1668._1_1_,(uchar)local_1668);
                if (uVar7 != 0xffffffff) {
                  puVar21 = (uint *)((long)&vctx->voccxwp[(ulong)uVar7 / 2000]->vocwnxt +
                                    (ulong)(uVar7 % 2000 << 3));
                  local_1668 = CONCAT11(local_1668._1_1_,(uchar)local_1668);
                }
              }
            }
            pvVar17 = (vocdef *)(local_15e0 + 1);
          }
          fiowcls((osfildef *)__stream_00,ctx,local_15d8);
          if ((flags & 1) != 0) {
            uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x06SYMTAB");
            toktheach(&tab->tokthsc,fiowrtsym,&cbctx);
            local_1668._0_1_ = 0;
            sVar11 = fwrite(&local_1668,4,1,__stream_00);
            if (sVar11 != 1) goto LAB_00117926;
            fiowcls((osfildef *)__stream_00,ctx,uVar13);
          }
          if (((flags & 0x82) == 0) || (vctx->voccxrun->runcxdbg == (dbgcxdef *)0x0)) {
LAB_00118136:
            if ((flags & 0x10) != 0) {
              uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x06PRPCNT");
              local_1668._0_1_ = (uchar)prpcnt;
              local_1668._1_1_ = (undefined1)(prpcnt >> 8);
              sVar11 = fwrite(&local_1668,2,1,__stream_00);
              if (sVar11 != 1) goto LAB_00117926;
              fiowcls((osfildef *)__stream_00,ctx,uVar13);
              uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x06TADSPP");
              tok_write_defines(local_15b8,(osfildef *)__stream_00,ctx);
              fiowcls((osfildef *)__stream_00,ctx,uVar13);
            }
            fiowhd((osfildef *)__stream_00,ctx,"\x04$EOF");
            fclose(__stream_00);
            if (cbctx.fiowcxund != 0) {
              errsigf(ctx,"TADS",0x25d);
            }
            os_settype(fname,0);
            vctx->voccxerr->errcxptr = fr_.errprv;
            return;
          }
          uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x03SRC");
          pplVar18 = &vctx->voccxrun->runcxdbg->dbgcxlin;
          do {
            plVar9 = *pplVar18;
            if (plVar9 == (lindef *)0x0) {
              fiowcls((osfildef *)__stream_00,ctx,uVar13);
              if ((char)flags < '\0') {
                uVar13 = fiowhd((osfildef *)__stream_00,ctx,"\x04SRC2");
                fiowcls((osfildef *)__stream_00,ctx,uVar13);
              }
              goto LAB_00118136;
            }
            iVar23 = (*plVar9->linwrtp)(plVar9,(osfildef *)__stream_00);
            pplVar18 = &plVar9->linnxt;
          } while (iVar23 == 0);
          goto LAB_00117926;
        }
        local_1600 = fiowhd((osfildef *)__stream_00,ctx,"\x03FST");
        uVar15 = ftell((FILE *)__stream);
        fseek((FILE *)__stream,0,0);
        do {
          if (uVar15 == 0) {
            fiowcls((osfildef *)__stream_00,ctx,local_1600);
            fclose((FILE *)__stream);
            osfdel_temp(fastnamebuf);
            goto LAB_00117961;
          }
          sVar11 = 0x400;
          if (uVar15 < 0x400) {
            sVar11 = uVar15;
          }
          sVar14 = fread(flag_buf,sVar11,1,(FILE *)__stream);
          if (sVar14 != 1) break;
          sVar14 = fwrite(flag_buf,sVar11,1,__stream_00);
          uVar15 = uVar15 - sVar11;
        } while (sVar14 == 1);
      }
    }
  }
LAB_0011791b:
LAB_00117926:
  errsigf(ctx,"TADS",0x259);
}

Assistant:

void fiowrt(mcmcxdef *mctx, voccxdef *vctx, tokcxdef *tokctx, tokthdef *tab,
            uchar *fmts, uint fmtl, char *fname, uint flags, objnum preinit,
            int extc, uint prpcnt, char *filever)
{
    osfildef *fp;
    
    /* open the file */
    if (!(fp = osfoprwtb(fname, OSFTGAME)))
        errsig(vctx->voccxerr, ERR_OPWGAM);
    
    ERRBEGIN(vctx->voccxerr)
    
    /* write the file */
    fiowrt1(mctx, vctx, tokctx, tab, fmts, fmtl, fp, flags, preinit,
            extc, prpcnt, filever);
    os_settype(fname, OSFTGAME);
   
    ERRCLEAN(vctx->voccxerr)
        /* clean up by closing the file */
        osfcls(fp);
    ERRENDCLN(vctx->voccxerr)
}